

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O3

bool __thiscall
cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
          (ElementsAddressFactory *this,ElementsConfidentialAddress *conf_addr,NetType net_type)

{
  bool bVar1;
  Address local_190 [16];
  undefined1 *local_180;
  undefined1 local_170 [16];
  void *local_160;
  void *local_148;
  void *local_130;
  code *local_118 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a0;
  Script local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  bVar1 = AddressFactory::CheckAddressNetType(&this->super_AddressFactory,local_190,net_type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48);
  core::Script::~Script(&local_88);
  local_118[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a0);
  core::TapBranch::~TapBranch((TapBranch *)local_118);
  if (local_130 != (void *)0x0) {
    operator_delete(local_130);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  return bVar1;
}

Assistant:

bool ElementsAddressFactory::CheckConfidentialAddressNetType(
    const ElementsConfidentialAddress& conf_addr, NetType net_type) const {
  return CheckAddressNetType(conf_addr.GetUnblindedAddress(), net_type);
}